

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DecorationManager::AddDecorationVal
          (DecorationManager *this,uint32_t inst_id,uint32_t decoration,uint32_t decoration_value)

{
  pointer pOVar1;
  Operand *__cur;
  SmallVector<unsigned_int,_2UL> *this_00;
  pointer *__ptr;
  long lVar2;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_158;
  undefined1 local_138 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_118;
  undefined1 local_110 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f0;
  undefined1 local_e8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_c8;
  undefined4 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  undefined1 local_58 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  local_e8._24_8_ = local_e8 + 0x10;
  local_e8._0_8_ = &PTR__SmallVector_00b15d78;
  local_c8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_e8._8_8_ = 1;
  this_00 = &local_b8;
  local_c0 = 1;
  local_b8._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b15d78;
  local_b8.size_ = 0;
  local_b8.small_data_ = (uint *)local_b8.buffer;
  local_b8.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_e8._16_4_ = inst_id;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (this_00,(SmallVector<unsigned_int,_2UL> *)local_e8);
  local_110._24_8_ = local_110 + 0x10;
  local_110._0_8_ = &PTR__SmallVector_00b15d78;
  local_f0._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_110._8_8_ = 1;
  local_90 = 6;
  local_88._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b15d78;
  local_88.size_ = 0;
  local_88.small_data_ = (uint *)local_88.buffer;
  local_88.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_110._16_4_ = decoration;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&local_88,(SmallVector<unsigned_int,_2UL> *)local_110);
  local_138._24_8_ = local_138 + 0x10;
  local_138._0_8_ = &PTR__SmallVector_00b15d78;
  local_118._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_138._8_8_ = 1;
  local_60 = 6;
  local_58._0_8_ = &PTR__SmallVector_00b15d78;
  local_58._8_8_ = 0;
  local_58._24_8_ = local_58 + 0x10;
  local_38._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_138._16_4_ = decoration_value;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_58,(SmallVector<unsigned_int,_2UL> *)local_138)
  ;
  local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 0x90;
  pOVar1 = (pointer)operator_new(0x90);
  local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar1 + 3;
  local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = pOVar1;
  do {
    pOVar1->type = *(spv_operand_type_t *)
                    &this_00[-1].large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
    (pOVar1->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b15d78;
    (pOVar1->words).size_ = 0;
    (pOVar1->words).small_data_ = (uint *)(pOVar1->words).buffer;
    (pOVar1->words).large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar1->words,this_00);
    pOVar1 = pOVar1 + 1;
    this_00 = (SmallVector<unsigned_int,_2UL> *)&this_00[1].size_;
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != 0);
  local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = pOVar1;
  AddDecoration(this,OpDecorate,&local_158);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_158);
  lVar2 = -0x90;
  this_01 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_38;
  do {
    *(undefined ***)(this_01 + -0x20) = &PTR__SmallVector_00b15d78;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01 !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this_01,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01);
    }
    *(undefined8 *)this_01 = 0;
    this_01 = this_01 + -0x30;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0);
  local_138._0_8_ = &PTR__SmallVector_00b15d78;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_118._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_118,local_118._M_head_impl);
  }
  local_110._0_8_ = &PTR__SmallVector_00b15d78;
  if (local_f0._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_f0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_f0._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_e8._0_8_ = &PTR__SmallVector_00b15d78;
  if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
      local_c8._M_head_impl !=
      (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_c8,local_c8._M_head_impl);
  }
  return;
}

Assistant:

void DecorationManager::AddDecorationVal(uint32_t inst_id, uint32_t decoration,
                                         uint32_t decoration_value) {
  AddDecoration(
      spv::Op::OpDecorate,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inst_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
        {decoration_value}}});
}